

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dynamic_metric.hpp
# Opt level: O0

pair<std::shared_ptr<ylt::metric::dynamic_metric_impl<ylt::metric::detail::summary_impl<unsigned_int,_6UL>,_(unsigned_char)__x02_>::metric_pair>,_bool>
* __thiscall
ylt::metric::
dynamic_metric_impl<ylt::metric::detail::summary_impl<unsigned_int,6ul>,(unsigned_char)2>::
try_emplace<std::array<std::__cxx11::string,2ul>const&,std::vector<double,std::allocator<double>>&>
          (dynamic_metric_impl<ylt::metric::detail::summary_impl<unsigned_int,_6UL>,_(unsigned_char)__x02_>
           *this,array<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_2UL>
                 *key,vector<double,_std::allocator<double>_> *args)

{
  vector<double,_std::allocator<double>_> *in_RCX;
  array<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_2UL>
  *in_RDX;
  anon_class_1_0_00000001 *in_RSI;
  pair<std::shared_ptr<ylt::metric::dynamic_metric_impl<ylt::metric::detail::summary_impl<unsigned_int,_6UL>,_(unsigned_char)__x02_>::metric_pair>,_bool>
  *in_RDI;
  map_sharded_t<std::unordered_map<std::span<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_2UL>,_ylt::metric::dynamic_metric_impl<ylt::metric::detail::summary_impl<unsigned_int,_6UL>,_(unsigned_char)__x02_>::value_type,_ylt::metric::dynamic_metric_impl<ylt::metric::detail::summary_impl<unsigned_int,_6UL>,_(unsigned_char)__x02_>::my_hash<131UL>,_ylt::metric::dynamic_metric_impl<ylt::metric::detail::summary_impl<unsigned_int,_6UL>,_(unsigned_char)__x02_>::my_equal,_std::allocator<std::pair<const_std::span<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_2UL>,_ylt::metric::dynamic_metric_impl<ylt::metric::detail::summary_impl<unsigned_int,_6UL>,_(unsigned_char)__x02_>::value_type>_>_>,_ylt::metric::dynamic_metric_impl<ylt::metric::detail::summary_impl<unsigned_int,_6UL>,_(unsigned_char)__x02_>::my_hash<137UL>_>
  *unaff_retaddr;
  span<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_2UL>
  view;
  pair<std::shared_ptr<ylt::metric::dynamic_metric_impl<ylt::metric::detail::summary_impl<unsigned_int,_6UL>,_(unsigned_char)__x02_>::metric_pair>,_bool>
  *key_00;
  
  key_00 = in_RDI;
  std::
  span<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_2UL>::
  span<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_2UL>
            ((span<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_2UL>
              *)in_RDI,
             (array<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_2UL>
              *)in_RSI);
  util::
  map_sharded_t<std::unordered_map<std::span<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_2UL>,_ylt::metric::dynamic_metric_impl<ylt::metric::detail::summary_impl<unsigned_int,_6UL>,_(unsigned_char)'\x02'>::value_type,_ylt::metric::dynamic_metric_impl<ylt::metric::detail::summary_impl<unsigned_int,_6UL>,_(unsigned_char)'\x02'>::my_hash<131UL>,_ylt::metric::dynamic_metric_impl<ylt::metric::detail::summary_impl<unsigned_int,_6UL>,_(unsigned_char)'\x02'>::my_equal,_std::allocator<std::pair<const_std::span<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_2UL>,_ylt::metric::dynamic_metric_impl<ylt::metric::detail::summary_impl<unsigned_int,_6UL>,_(unsigned_char)'\x02'>::value_type>_>_>,_ylt::metric::dynamic_metric_impl<ylt::metric::detail::summary_impl<unsigned_int,_6UL>,_(unsigned_char)'\x02'>::my_hash<137UL>_>
  ::
  try_emplace_with_op<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_qicosmos[P]cinatra_include_cinatra_ylt_metric_dynamic_metric_hpp:115:9),_const_std::array<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_2UL>_&,_std::vector<double,_std::allocator<double>_>_&>
            (unaff_retaddr,(key_type *)key_00,in_RSI,in_RDX,in_RCX);
  return in_RDI;
}

Assistant:

std::pair<std::shared_ptr<metric_pair>, bool> try_emplace(Key&& key,
                                                            Args&&... args) {
    std::span<const std::string, N> view = key;
    return map_.try_emplace_with_op(
        view,
        [](auto result) {
          if (result.second) {
            *const_cast<std::span<const std::string, N>*>(
                &result.first->first) = result.first->second->label;
          }
        },
        std::forward<Key>(key), std::forward<Args>(args)...);
  }